

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-split.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  size_t *psVar1;
  __node_base_ptr *pp_Var2;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  *this;
  _Rb_tree_header *p_Var3;
  string *psVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg;
  pointer *ppuVar5;
  Export *pEVar6;
  ulong uVar7;
  pointer __n;
  string filename;
  string filename_00;
  string filename_01;
  string filename_02;
  string filename_03;
  undefined1 auVar8 [16];
  pointer puVar9;
  size_t this_00;
  bool bVar10;
  char cVar11;
  int iVar12;
  _Base_ptr p_Var13;
  undefined8 uVar14;
  const_iterator cVar15;
  _Rb_tree_node_base *p_Var16;
  uint64_t uVar17;
  char *pcVar18;
  Instrumenter *this_01;
  ostream *poVar19;
  istream *piVar20;
  _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
  _Var21;
  pointer pbVar22;
  long *plVar23;
  _Base_ptr p_Var24;
  long lVar25;
  long *plVar26;
  string *file;
  ulong uVar27;
  undefined8 *puVar28;
  long lVar29;
  undefined8 *puVar30;
  long lVar31;
  ulong uVar32;
  pointer puVar33;
  iterator __begin2;
  iterator __end2;
  undefined1 auVar34 [8];
  byte bVar35;
  Name NVar36;
  Name NVar37;
  Name NVar38;
  Name NVar39;
  pair<std::_Rb_tree_iterator<wasm::Name>,_std::_Rb_tree_iterator<wasm::Name>_> pVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>,_bool>
  pVar43;
  Name name;
  Name name_00;
  Name name_01;
  Name name_02;
  Name name_03;
  Name name_04;
  Name name_05;
  undefined1 auStack_f38 [8];
  undefined1 local_f30 [8];
  Module wasm;
  WasmSplitOptions options;
  set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> keepFuncs_1;
  undefined1 local_498 [272];
  undefined1 auStack_388 [8];
  set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> splitFuncs_1;
  undefined1 local_340 [16];
  __node_base local_330;
  _Hash_node_base *local_328;
  _Hash_node_base local_320;
  size_t sStack_318;
  __node_base_ptr local_310;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_308 [4];
  Module *local_1f8;
  WasmSplitOptions *local_1f0;
  undefined1 local_1e8 [24];
  anon_class_8_1_38e0b97e printFnSet;
  _Base_ptr local_1c8;
  _Rb_tree_node_base *p_Stack_1c0;
  _Head_base<0UL,_wasm::Global_*,_false> *local_1a8 [2];
  _Head_base<0UL,_wasm::Global_*,_false> local_198 [2];
  undefined1 local_188 [8];
  string currModule;
  undefined1 local_158 [8];
  string line;
  undefined1 local_128 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  Results splitResults;
  undefined1 local_c0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> splitFuncs;
  set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> keepFuncs;
  
  bVar35 = 0;
  pp_Var2 = &wasm.tagsMap._M_h._M_single_bucket;
  ::wasm::WasmSplitOptions::WasmSplitOptions((WasmSplitOptions *)pp_Var2);
  ::wasm::WasmSplitOptions::parse((WasmSplitOptions *)pp_Var2,argc,argv);
  bVar10 = ::wasm::WasmSplitOptions::validate
                     ((WasmSplitOptions *)&wasm.tagsMap._M_h._M_single_bucket);
  auVar41._8_8_ = wasm.name.super_IString.str._M_len;
  auVar41._0_4_ = wasm.features.features;
  auVar41[4] = wasm.hasFeaturesSection;
  auVar41._5_3_ = wasm._381_3_;
  if (!bVar10) {
    ::wasm::Fatal::Fatal((Fatal *)(auStack_f38 + 8));
    ::wasm::Fatal::operator<<
              ((Fatal *)(auStack_f38 + 8),(char (*) [31])"Invalid command line arguments");
LAB_0010fc7f:
    ::wasm::Fatal::~Fatal((Fatal *)(auStack_f38 + 8));
  }
  switch(options.super_ToolOptions.enabledFeatures.features) {
  case 0:
    ::wasm::Module::Module((Module *)(auStack_f38 + 8));
    anon_unknown.dwarf_3e7fa::parseInput
              ((Module *)(auStack_f38 + 8),(WasmSplitOptions *)&wasm.tagsMap._M_h._M_single_bucket);
    puVar9 = wasm.functions.
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    keepFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&keepFuncs;
    keepFuncs._M_t._M_impl._0_4_ = 0;
    keepFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    keepFuncs._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    keepFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    p_Var24 = (_Base_ptr)&splitFuncs;
    splitFuncs._M_t._M_impl._0_4_ = 0;
    splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = p_Var24;
    splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_left = p_Var24;
    keepFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         keepFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (options.profileFile._M_dataplus._M_p == (pointer)0x0) {
      if (((char)options.splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count == '\x01') &&
         ((options.splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count._1_1_ & 1) == 0)) {
        if (wasm.exports.
            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage !=
            (pointer)wasm.functions.
                     super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) {
          puVar33 = wasm.exports.
                    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
          do {
            pEVar6 = (puVar33->_M_t).
                     super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                     super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                     super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
            if (*(long *)((long)&(pEVar6->value).super__Variant_base<wasm::Name,_wasm::HeapType> + 8
                         ) == 0) {
              std::
              _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
              ::_M_insert_unique<wasm::Name_const&>
                        ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                          *)(__str_1.field_2._M_local_buf + 8),&pEVar6->name);
            }
            puVar33 = puVar33 + 1;
          } while (puVar33 != (pointer)puVar9);
        }
      }
      else if (wasm.exports.
               super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage !=
               (pointer)wasm.functions.
                        super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) {
        puVar33 = wasm.exports.
                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        do {
          pEVar6 = (puVar33->_M_t).
                   super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                   super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
          if (*(long *)((long)&(pEVar6->value).super__Variant_base<wasm::Name,_wasm::HeapType> + 8)
              == 0) {
            std::
            _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
            ::_M_insert_unique<wasm::Name_const&>
                      ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                        *)&splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count,&pEVar6->name
                      );
          }
          puVar33 = puVar33 + 1;
        } while (puVar33 != (pointer)puVar9);
      }
    }
    else {
      uVar17 = anon_unknown.dwarf_3e7fa::hashFile((string *)options._560_8_);
      p_Var24 = (_Base_ptr)&splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count;
      anon_unknown.dwarf_3e7fa::getFunctionsToKeepAndSplit
                ((Module *)(auStack_f38 + 8),uVar17,(string *)&options.usePlaceholders,
                 (set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)p_Var24,
                 (set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)
                 ((long)&__str_1.field_2 + 8));
    }
    if (options.keepFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
        (_Base_ptr)&options.keepFuncs) {
      this = (_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
              *)((long)&__str_1.field_2 + 8);
      p_Var13 = options.keepFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      do {
        NVar36.super_IString.str._M_str = *(char **)(p_Var13 + 1);
        NVar36.super_IString.str._M_len = (size_t)(auStack_f38 + 8);
        lVar25 = ::wasm::Module::getFunctionOrNull(NVar36);
        if (lVar25 == 0) {
          if ((char)options.super_ToolOptions.passOptions.passesToSkip._M_h._M_single_bucket == '\0'
             ) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"warning: function ",0x12);
            name.super_IString.str._M_str = (char *)p_Var24;
            name.super_IString.str._M_len = (size_t)p_Var13[1]._M_parent;
            poVar19 = ::wasm::operator<<((wasm *)&std::cerr,*(ostream **)(p_Var13 + 1),name);
            std::__ostream_insert<char,std::char_traits<char>>(poVar19," does not exist\n",0x10);
          }
        }
        else {
          std::
          _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
          ::_M_insert_unique<wasm::Name_const&>
                    ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                      *)&splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (Name *)(p_Var13 + 1));
          pVar40 = std::
                   _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   ::equal_range(this,(key_type *)(p_Var13 + 1));
          std::
          _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
          ::_M_erase_aux(this,(_Base_ptr)pVar40.first._M_node,(_Base_ptr)pVar40.second._M_node);
        }
        p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
      } while (p_Var13 != (_Base_ptr)&options.keepFuncs);
    }
    if (options.splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
        (_Base_ptr)&options.splitFuncs) {
      p_Var13 = options.splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      do {
        NVar37.super_IString.str._M_str = *(char **)(p_Var13 + 1);
        NVar37.super_IString.str._M_len = (size_t)(auStack_f38 + 8);
        lVar25 = ::wasm::Module::getFunctionOrNull(NVar37);
        if (lVar25 == 0) {
          if ((char)options.super_ToolOptions.passOptions.passesToSkip._M_h._M_single_bucket == '\0'
             ) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"warning: function ",0x12);
            name_01.super_IString.str._M_str = (char *)p_Var24;
            name_01.super_IString.str._M_len = (size_t)p_Var13[1]._M_parent;
            poVar19 = ::wasm::operator<<((wasm *)&std::cerr,*(ostream **)(p_Var13 + 1),name_01);
            lVar25 = 0x10;
            pcVar18 = " does not exist\n";
LAB_0010dd56:
            std::__ostream_insert<char,std::char_traits<char>>(poVar19,pcVar18,lVar25);
          }
        }
        else if (*(long *)(lVar25 + 0x20) == 0) {
          p_Var16 = p_Var13 + 1;
          if ((char)options.super_ToolOptions.passOptions.passesToSkip._M_h._M_single_bucket == '\0'
             ) {
            cVar15 = std::
                     _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                     ::find((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                             *)((long)&options.profileExport.field_2 + 8),(key_type *)p_Var16);
            p_Var24 = (_Base_ptr)&options.keepFuncs;
            if (cVar15._M_node != p_Var24) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"warning: function ",0x12);
              name_02.super_IString.str._M_str = (char *)p_Var24;
              name_02.super_IString.str._M_len = (size_t)p_Var13[1]._M_parent;
              poVar19 = ::wasm::operator<<((wasm *)&std::cerr,*(ostream **)(p_Var13 + 1),name_02);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar19," was to be both kept and split. It will be split.\n",0x32);
            }
          }
          std::
          _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
          ::_M_insert_unique<wasm::Name_const&>
                    ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                      *)(__str_1.field_2._M_local_buf + 8),(Name *)p_Var16);
          pVar40 = std::
                   _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   ::equal_range((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                                  *)&splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                 (key_type *)p_Var16);
          std::
          _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
          ::_M_erase_aux((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                          *)&splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count,
                         (_Base_ptr)pVar40.first._M_node,(_Base_ptr)pVar40.second._M_node);
        }
        else if ((char)options.super_ToolOptions.passOptions.passesToSkip._M_h._M_single_bucket ==
                 '\0') {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"warning: cannot split out imported function ",0x2c);
          name_00.super_IString.str._M_str = (char *)p_Var24;
          name_00.super_IString.str._M_len = (size_t)p_Var13[1]._M_parent;
          poVar19 = ::wasm::operator<<((wasm *)&std::cerr,*(ostream **)(p_Var13 + 1),name_00);
          lVar25 = 1;
          pcVar18 = "\n";
          goto LAB_0010dd56;
        }
        p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
      } while (p_Var13 != (_Base_ptr)&options.splitFuncs);
    }
    if (((char)options.super_ToolOptions.passOptions.passesToSkip._M_h._M_single_bucket == '\0') &&
       (keepFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_right == (_Base_ptr)0x0)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"warning: not keeping any functions in the primary module\n",
                 0x39);
    }
    if (options.storageKind._2_1_ == 1) {
      std::
      _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
      ::_M_insert_unique<wasm::Name_const&>
                ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                  *)&splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (Name *)::wasm::ModuleSplitting::LOAD_SECONDARY_MODULE);
      pVar40 = std::
               _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               ::equal_range((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                              *)((long)&__str_1.field_2 + 8),
                             (key_type *)::wasm::ModuleSplitting::LOAD_SECONDARY_MODULE);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::_M_erase_aux((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                      *)((long)&__str_1.field_2 + 8),(_Base_ptr)pVar40.first._M_node,
                     (_Base_ptr)pVar40.second._M_node);
    }
    if (((char)options.super_ToolOptions.passOptions.passesToSkip._M_h._M_single_bucket == '\0') &&
       (splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_right == (_Base_ptr)0x0)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "warning: not splitting any functions out to the secondary module\n",0x41);
    }
    if (options.mode._2_1_ == 1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Keeping functions: ",0x13);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                  *)local_188,
                 (_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                  *)&splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count);
      for (uVar14 = currModule.field_2._M_allocated_capacity;
          (_Rb_tree_node_base *)uVar14 != (_Rb_tree_node_base *)&currModule;
          uVar14 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar14)) {
        if (uVar14 != currModule.field_2._M_allocated_capacity) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
        }
        name_03.super_IString.str._M_str = (char *)p_Var24;
        name_03.super_IString.str._M_len =
             (size_t)((_Rb_tree_node_base *)(uVar14 + 0x20))->_M_parent;
        ::wasm::operator<<((wasm *)&std::cout,*(ostream **)(uVar14 + 0x20),name_03);
      }
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)local_188);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Splitting out functions: ",0x19);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                  *)local_158,
                 (_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                  *)((long)&__str_1.field_2 + 8));
      for (uVar14 = line.field_2._M_allocated_capacity;
          (_Rb_tree_node_base *)uVar14 != (_Rb_tree_node_base *)&line;
          uVar14 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar14)) {
        if (uVar14 != line.field_2._M_allocated_capacity) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
        }
        name_04.super_IString.str._M_str = (char *)p_Var24;
        name_04.super_IString.str._M_len =
             (size_t)((_Rb_tree_node_base *)(uVar14 + 0x20))->_M_parent;
        ::wasm::operator<<((wasm *)&std::cout,*(ostream **)(uVar14 + 0x20),name_04);
      }
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)local_158);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    }
    if (wasm.exports.
        super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage !=
        (pointer)wasm.functions.
                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) {
      puVar33 = wasm.exports.
                super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      do {
        pEVar6 = (puVar33->_M_t).
                 super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                 super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
        if (((*(long *)((long)&(pEVar6->value).super__Variant_base<wasm::Name,_wasm::HeapType> + 8)
              == 0) &&
            (cVar15 = std::
                      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                      ::find((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                              *)&splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count,
                             &pEVar6->name), cVar15._M_node == (_Base_ptr)&keepFuncs)) &&
           (cVar15 = std::
                     _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                     ::find((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                             *)((long)&__str_1.field_2 + 8),&pEVar6->name),
           cVar15._M_node == (_Base_ptr)&splitFuncs)) {
          __assert_fail("keepFuncs.count(func->name) || splitFuncs.count(func->name)",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/wasm-split.cpp"
                        ,0x13c,
                        "auto (anonymous namespace)::splitModule(const WasmSplitOptions &)::(anonymous class)::operator()(Function *) const"
                       );
        }
        puVar33 = puVar33 + 1;
      } while (puVar33 !=
               (pointer)wasm.functions.
                        super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
    }
    splitFuncs_1._M_t._M_impl._0_8_ = (ulong)(uint)splitFuncs_1._M_t._M_impl._4_4_ << 0x20;
    splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_node_count._0_1_ = 1;
    splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&splitFuncs_1;
    splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&splitFuncs_1;
    ::wasm::IString::interned(7,"primary",0);
    local_340 = ::wasm::IString::interned(0xb,"placeholder",0);
    local_328 = (_Hash_node_base *)0x0;
    local_320._M_nxt = local_320._M_nxt & 0xffffffffffffff00;
    local_310 = (__node_base_ptr)((ulong)local_310 & 0xffffffffffff0000);
    local_330._M_nxt = &local_320;
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::clear((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
             *)auStack_388);
    if (splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ != 0) {
      splitFuncs_1._M_t._M_impl._0_4_ = splitFuncs._M_t._M_impl._0_4_;
      splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
      splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ =
           splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._4_4_;
      splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      *(_Base_ptr *)(splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 8) =
           (_Base_ptr)&splitFuncs_1;
      splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
      splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&splitFuncs;
      splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    }
    if (options.importNamespace._M_dataplus._M_p != (pointer)0x0) {
      ::wasm::IString::interned
                (options.importNamespace._M_dataplus._M_p,options.secondaryOutput.field_2._8_8_,0);
    }
    auVar41 = local_340;
    if (options.placeholderNamespace._M_dataplus._M_p != (pointer)0x0) {
      auVar41 = ::wasm::IString::interned
                          (options.placeholderNamespace._M_dataplus._M_p,
                           options.importNamespace.field_2._8_8_,0);
    }
    local_340 = auVar41;
    if (options.exportPrefix._M_dataplus._M_p != (pointer)0x0) {
      std::__cxx11::string::_M_assign((string *)&local_330);
    }
    splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_node_count._0_1_ = (undefined1)options.mode;
    local_310 = (__node_base_ptr)
                (CONCAT62(local_310._2_6_,
                          CONCAT11(options.storageKind._2_1_,
                                   options.super_ToolOptions.passOptions.inlining.partialInliningIfs
                                   ._2_1_)) ^ 1);
    ::wasm::ModuleSplitting::splitFunctions
              ((Module *)((long)&__str.field_2 + 8),(Config *)(auStack_f38 + 8));
    anon_unknown.dwarf_3e7fa::adjustTableSize
              ((anon_unknown_dwarf_3e7fa *)
               wasm.dataSegments.
               super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (Module *)
               wasm.tables.
               super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,options.outPrefix.field_2._8_4_,false);
    pcVar18 = (char *)0x1;
    anon_unknown.dwarf_3e7fa::adjustTableSize
              (*(anon_unknown_dwarf_3e7fa **)(__str.field_2._8_8_ + 0xa8),
               *(Module **)(__str.field_2._8_8_ + 0xb0),options.outPrefix.field_2._8_4_,true);
    if ((undefined1)options.storageKind == InMemory) {
      local_128 = (undefined1  [8])&__str._M_string_length;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_128,options.output.field_2._8_8_,
                 options.primaryOutput._M_dataplus._M_p + options.output.field_2._8_8_);
      std::__cxx11::string::append(local_128);
      anon_unknown.dwarf_3e7fa::writeSymbolMap((Module *)(auStack_f38 + 8),(string *)local_128);
      if (local_128 != (undefined1  [8])&__str._M_string_length) {
        operator_delete((void *)local_128,__str._M_string_length + 1);
      }
      uVar14 = __str.field_2._8_8_;
      local_c0 = (undefined1  [8])&__str_1._M_string_length;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_c0,options.primaryOutput.field_2._8_8_,
                 options.secondaryOutput._M_dataplus._M_p + options.primaryOutput.field_2._8_8_);
      std::__cxx11::string::append(local_c0);
      anon_unknown.dwarf_3e7fa::writeSymbolMap((Module *)uVar14,(string *)local_c0);
      if (local_c0 != (undefined1  [8])&__str_1._M_string_length) {
        operator_delete((void *)local_c0,__str_1._M_string_length + 1);
      }
    }
    if (options.storageKind._1_1_ == 1) {
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_wasm::Name>,_std::_Select1st<std::pair<const_unsigned_long,_wasm::Name>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wasm::Name>_>_>
      ::_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_wasm::Name>,_std::_Select1st<std::pair<const_unsigned_long,_wasm::Name>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wasm::Name>_>_>
                  *)(local_1e8 + 0x10),
                 (_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_wasm::Name>,_std::_Select1st<std::pair<const_unsigned_long,_wasm::Name>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wasm::Name>_>_>
                  *)&splitResults);
      local_1a8[0] = local_198;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1a8,options.output.field_2._8_8_,
                 options.primaryOutput._M_dataplus._M_p + options.output.field_2._8_8_);
      std::__cxx11::string::append((char *)local_1a8);
      ::wasm::Output::Output
                ((Output *)
                 &options.usedOptions.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_1a8,Text);
      if (p_Stack_1c0 != (_Rb_tree_node_base *)&printFnSet) {
        p_Var16 = p_Stack_1c0;
        do {
          poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)local_498);
          local_1f8._0_1_ = (string)0x3a;
          poVar19 = std::__ostream_insert<char,std::char_traits<char>>(poVar19,(char *)&local_1f8,1)
          ;
          name_05.super_IString.str._M_str = pcVar18;
          name_05.super_IString.str._M_len = (size_t)p_Var16[1]._M_left;
          poVar19 = ::wasm::operator<<((wasm *)poVar19,(ostream *)p_Var16[1]._M_parent,name_05);
          local_1f8 = (Module *)CONCAT71(local_1f8._1_7_,10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar19,(char *)&local_1f8,1);
          p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16);
        } while (p_Var16 != (_Rb_tree_node_base *)&printFnSet);
      }
      ::wasm::Output::~Output
                ((Output *)
                 &options.usedOptions.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (local_1a8[0] != local_198) {
        operator_delete(local_1a8[0],
                        (ulong)((long)&((local_198[0]._M_head_impl)->super_Importable).super_Named.
                                       name.super_IString.str + 1));
      }
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_wasm::Name>,_std::_Select1st<std::pair<const_unsigned_long,_wasm::Name>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wasm::Name>_>_>
      ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_wasm::Name>,_std::_Select1st<std::pair<const_unsigned_long,_wasm::Name>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wasm::Name>_>_>
                   *)(local_1e8 + 0x10));
    }
    if (options.storageKind._3_1_ == 1) {
      if (wasm.name.super_IString.str._M_len == 0) {
        ::wasm::Path::getBaseName
                  ((string *)
                   &options.usedOptions.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        wasm._376_16_ =
             ::wasm::IString::interned
                       (CONCAT44(keepFuncs_1._M_t._M_impl._4_4_,keepFuncs_1._M_t._M_impl._0_4_),
                        options.usedOptions.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
        if ((_Rb_tree_header *)
            options.usedOptions.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage !=
            &keepFuncs_1._M_t._M_impl.super__Rb_tree_header) {
          operator_delete(options.usedOptions.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          keepFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
        }
      }
      ::wasm::Path::getBaseName
                ((string *)
                 &options.usedOptions.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      auVar41 = ::wasm::IString::interned
                          (CONCAT44(keepFuncs_1._M_t._M_impl._4_4_,keepFuncs_1._M_t._M_impl._0_4_),
                           options.usedOptions.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
      *(undefined1 (*) [16])(__str.field_2._8_8_ + 0x180) = auVar41;
      if ((_Rb_tree_header *)
          options.usedOptions.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage !=
          &keepFuncs_1._M_t._M_impl.super__Rb_tree_header) {
        operator_delete(options.usedOptions.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        keepFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
      }
    }
    p_Var3 = &keepFuncs_1._M_t._M_impl.super__Rb_tree_header;
    options.usedOptions.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)p_Var3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)
               &options.usedOptions.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,options.output.field_2._8_8_,
               options.primaryOutput._M_dataplus._M_p + options.output.field_2._8_8_);
    filename.field_2._M_allocated_capacity =
         (size_type)
         wasm.exports.
         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    filename._0_16_ = _auStack_f38;
    filename.field_2._8_8_ =
         wasm.exports.
         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    anon_unknown.dwarf_3e7fa::writeModule
              ((anon_unknown_dwarf_3e7fa *)(auStack_f38 + 8),
               (Module *)
               options.usedOptions.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,filename,
               (WasmSplitOptions *)
               CONCAT44(keepFuncs_1._M_t._M_impl._4_4_,keepFuncs_1._M_t._M_impl._0_4_));
    if ((_Rb_tree_header *)
        options.usedOptions.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage != p_Var3) {
      operator_delete(options.usedOptions.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      keepFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
    }
    uVar14 = __str.field_2._8_8_;
    local_1f8 = (Module *)local_1e8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1f8,options.primaryOutput.field_2._8_8_,
               options.secondaryOutput._M_dataplus._M_p + options.primaryOutput.field_2._8_8_);
    filename_00.field_2._M_allocated_capacity =
         (size_type)
         wasm.exports.
         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    filename_00._0_16_ = _auStack_f38;
    filename_00.field_2._8_8_ =
         wasm.exports.
         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    anon_unknown.dwarf_3e7fa::writeModule
              ((anon_unknown_dwarf_3e7fa *)uVar14,local_1f8,filename_00,local_1f0);
    if (local_1f8 != (Module *)local_1e8) {
      operator_delete(local_1f8,
                      (ulong)((long)&(((__uniq_ptr_data<wasm::Export,_std::default_delete<wasm::Export>,_true,_true>
                                        *)local_1e8._0_8_)->
                                     super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                     )._M_t.
                                     super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                     .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl + 1)
                     );
    }
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_wasm::Name>,_std::_Select1st<std::pair<const_unsigned_long,_wasm::Name>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wasm::Name>_>_>
    ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_wasm::Name>,_std::_Select1st<std::pair<const_unsigned_long,_wasm::Name>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wasm::Name>_>_>
                 *)&splitResults);
    std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::~unique_ptr
              ((unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_> *)
               ((long)&__str.field_2 + 8));
    if (local_330._M_nxt != &local_320) {
      operator_delete(local_330._M_nxt,(ulong)((long)&(local_320._M_nxt)->_M_nxt + 1));
    }
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)auStack_388);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)((long)&__str_1.field_2 + 8));
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)&splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count);
    auVar8 = (undefined1  [16])wasm._376_16_;
    break;
  case 1:
    if (options.manifestFile._M_dataplus._M_p == (pointer)0x0) {
      ::wasm::Fatal::Fatal((Fatal *)(auStack_f38 + 8));
      ::wasm::Fatal::operator<<
                ((Fatal *)(auStack_f38 + 8),(char (*) [34])"--multi-split requires --manifest");
    }
    else if (options.output._M_dataplus._M_p == (pointer)0x0) {
      ::wasm::Fatal::Fatal((Fatal *)(auStack_f38 + 8));
      ::wasm::Fatal::operator<<
                ((Fatal *)(auStack_f38 + 8),(char (*) [32])"--multi-split requires --output");
    }
    else {
      arg = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            (options.exportPrefix.field_2._M_local_buf + 8);
      std::ifstream::ifstream
                (&options.usedOptions.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)arg,_S_in);
      cVar11 = std::__basic_file<char>::is_open();
      if (cVar11 != '\0') {
        ::wasm::Module::Module((Module *)(auStack_f38 + 8));
        anon_unknown.dwarf_3e7fa::parseInput
                  ((Module *)(auStack_f38 + 8),
                   (WasmSplitOptions *)&wasm.tagsMap._M_h._M_single_bucket);
        splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&splitFuncs;
        splitFuncs._M_t._M_impl._0_4_ = 0;
        pbVar22 = (pointer)0x0;
        splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
        local_188 = (undefined1  [8])&currModule._M_string_length;
        currModule._M_dataplus._M_p = (pointer)0x0;
        currModule._M_string_length._0_1_ = 0;
        __str.field_2._8_8_ =
             &splitResults.placeholderMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
        splitResults.secondary._M_t.
        super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
        super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
        super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl =
             (__uniq_ptr_data<wasm::Module,_std::default_delete<wasm::Module>,_true,_true>)
             (__uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>)0x1;
        splitResults.placeholderMap._M_t._M_impl._0_8_ = 0;
        splitResults.placeholderMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        splitResults.placeholderMap._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        splitResults.placeholderMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ =
             0x3f800000;
        splitResults.placeholderMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             (_Base_ptr)0x0;
        splitResults.placeholderMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             (_Base_ptr)0x0;
        local_158 = (undefined1  [8])&line._M_string_length;
        line._M_dataplus._M_p = (pointer)0x0;
        line._M_string_length._0_1_ = 0;
        bVar10 = true;
        splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        while( true ) {
          cVar11 = std::ios::widen((char)options.usedOptions.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage[-1].
                                         _M_string_length + (char)&options + -0x60);
          piVar20 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                              ((istream *)
                               &options.usedOptions.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (string *)local_158,cVar11);
          if (((byte)piVar20[*(long *)(*(long *)piVar20 + -0x18) + 0x20] & 5) != 0) break;
          if (line._M_dataplus._M_p == (pointer)0x0) {
            bVar10 = true;
          }
          else if (bVar10) {
            std::__cxx11::string::_M_assign((string *)local_188);
            bVar10 = false;
            pbVar22 = (pointer)std::
                               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                             *)((long)&__str_1.field_2 + 8),
                                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_158);
          }
          else {
            if (pbVar22 == (pointer)0x0) {
              __assert_fail("currFuncs",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/wasm-split.cpp"
                            ,0x194,
                            "void (anonymous namespace)::multiSplitModule(const WasmSplitOptions &)"
                           );
            }
            auStack_388 = (undefined1  [8])pbVar22;
            std::
            _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
            ::
            _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                      ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        *)pbVar22,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_158,
                       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)auStack_388);
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                      ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)auStack_388,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_158,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_188);
            pVar43 = std::
                     _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                     ::_M_emplace<std::pair<std::__cxx11::string_const,std::__cxx11::string>>
                               ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                                 *)((long)&__str.field_2 + 8),
                                (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)auStack_388);
            _Var21 = pVar43.first.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                     ._M_cur;
            if (splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
                (_Base_ptr)&splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_node_count) {
              operator_delete(splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                              CONCAT71(splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_node_count
                                       ._1_7_,(undefined1)
                                              splitFuncs_1._M_t._M_impl.super__Rb_tree_header.
                                              _M_node_count) + 1);
            }
            if (auStack_388 != (undefined1  [8])&splitFuncs_1._M_t._M_impl.super__Rb_tree_header) {
              operator_delete((void *)auStack_388,
                              splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
            }
            if (((undefined1  [16])pVar43 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
              __n = *(pointer *)
                     ((long)_Var21.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                            ._M_cur + 0x30);
              if ((__n != currModule._M_dataplus._M_p) ||
                 ((__n != (pointer)0x0 &&
                  (iVar12 = bcmp(*(void **)((long)_Var21.
                                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                                  ._M_cur + 0x28),(void *)local_188,(size_t)__n),
                  iVar12 != 0)))) {
                ::wasm::Fatal::Fatal((Fatal *)auStack_388);
                p_Var3 = &splitFuncs_1._M_t._M_impl.super__Rb_tree_header;
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)p_Var3,"Function ",9);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)p_Var3,(char *)local_158,(long)line._M_dataplus._M_p);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)p_Var3,"cannot be assigned to module ",0x1d);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)p_Var3,(char *)local_188,(long)currModule._M_dataplus._M_p);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)p_Var3,"; it is already assigned to module ",0x23);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)p_Var3,
                           *(char **)((long)_Var21.
                                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                            ._M_cur + 0x28),
                           *(long *)((long)_Var21.
                                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                           ._M_cur + 0x30));
                splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count =
                     CONCAT71(splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count._1_7_,10);
                ::wasm::Fatal::operator<<
                          ((Fatal *)auStack_388,
                           (char *)&splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count);
                ::wasm::Fatal::~Fatal((Fatal *)auStack_388);
              }
            }
            else if ((char)options.super_ToolOptions.passOptions.passesToSkip._M_h._M_single_bucket
                     == '\0') {
              pcVar18 = (char *)::wasm::IString::interned(line._M_dataplus._M_p,local_158,0);
              NVar39.super_IString.str._M_str = pcVar18;
              NVar39.super_IString.str._M_len = (size_t)(auStack_f38 + 8);
              lVar25 = ::wasm::Module::getFunctionOrNull(NVar39);
              if (lVar25 == 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"warning: Function ",0x12);
                poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,(char *)local_158,
                                     (long)line._M_dataplus._M_p);
                std::__ostream_insert<char,std::char_traits<char>>(poVar19," does not exist\n",0x10)
                ;
              }
            }
          }
        }
        splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)&splitFuncs_1;
        splitFuncs_1._M_t._M_impl._0_8_ = splitFuncs_1._M_t._M_impl._0_8_ & 0xffffffff00000000;
        splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
        splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_node_count._0_1_ = 1;
        splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        ::wasm::IString::interned(7,"primary",0);
        local_340 = ::wasm::IString::interned(0xb,"placeholder",0);
        local_330._M_nxt = &local_320;
        local_328 = (_Hash_node_base *)0x0;
        local_320._M_nxt = local_320._M_nxt & 0xffffffffffffff00;
        local_310 = (__node_base_ptr)((ulong)local_310 & 0xffffffffffff0000);
        splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_node_count._0_1_ = Split;
        ::wasm::IString::interned(0,"",0);
        local_310 = (__node_base_ptr)CONCAT71(local_310._1_7_,1);
        if (splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
            (_Base_ptr)&splitFuncs) {
          psVar1 = &splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count;
          p_Var24 = splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          do {
            if (options.mode._2_1_ == 1) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Splitting module ",0x11);
              poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,*(char **)(p_Var24 + 1),
                                   (long)p_Var24[1]._M_parent);
              splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count =
                   CONCAT71(splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count._1_7_,10);
              std::__ostream_insert<char,std::char_traits<char>>(poVar19,(char *)psVar1,1);
            }
            if (((char)options.super_ToolOptions.passOptions.passesToSkip._M_h._M_single_bucket ==
                 '\0') && (p_Var24[2]._M_right == (_Base_ptr)0x0)) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"warning: Module ",0x10);
              poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,*(char **)(p_Var24 + 1),
                                   (long)p_Var24[1]._M_parent);
              std::__ostream_insert<char,std::char_traits<char>>(poVar19," will be empty\n",0xf);
            }
            std::set<wasm::Name,std::less<wasm::Name>,std::allocator<wasm::Name>>::
            set<std::__detail::_Node_iterator<std::__cxx11::string,true,true>>
                      ((set<wasm::Name,std::less<wasm::Name>,std::allocator<wasm::Name>> *)psVar1,
                       (_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                        )p_Var24[2]._M_left,
                       (_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                        )0x0);
            std::
            _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
            ::clear((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                     *)auStack_388);
            if (keepFuncs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ != 0) {
              splitFuncs_1._M_t._M_impl._0_4_ = keepFuncs._M_t._M_impl._0_4_;
              splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                   keepFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
              splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ =
                   keepFuncs._M_t._M_impl.super__Rb_tree_header._M_header._4_4_;
              splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                   keepFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   keepFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              *(set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> **)
               (keepFuncs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 8) = &splitFuncs_1;
              splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   keepFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
              keepFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              keepFuncs._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
              keepFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                   (_Base_ptr)&keepFuncs;
              keepFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
              keepFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   keepFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            }
            std::
            _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
            ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                         *)psVar1);
            ::wasm::ModuleSplitting::splitFunctions((Module *)psVar1,(Config *)(auStack_f38 + 8));
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_128,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&options.manifestFile.field_2 + 8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (p_Var24 + 1));
            plVar23 = (long *)std::__cxx11::string::append((char *)local_128);
            plVar26 = plVar23 + 2;
            if ((__node_base_ptr *)*plVar23 == (__node_base_ptr *)plVar26) {
              local_1c8 = (_Base_ptr)*plVar26;
              p_Stack_1c0 = (_Rb_tree_node_base *)plVar23[3];
              local_1e8._16_8_ = &local_1c8;
            }
            else {
              local_1c8 = (_Base_ptr)*plVar26;
              local_1e8._16_8_ = (__node_base_ptr *)*plVar23;
            }
            printFnSet.options = (WasmSplitOptions *)plVar23[1];
            *plVar23 = (long)plVar26;
            plVar23[1] = 0;
            *(undefined1 *)(plVar23 + 2) = 0;
            if (local_128 != (undefined1  [8])&__str._M_string_length) {
              operator_delete((void *)local_128,__str._M_string_length + 1);
            }
            this_00 = splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count;
            local_c0 = (undefined1  [8])&__str_1._M_string_length;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_c0,local_1e8._16_8_,
                       (undefined1 *)
                       ((long)&((printFnSet.options)->super_ToolOptions)._vptr_ToolOptions +
                       local_1e8._16_8_));
            filename_02.field_2._M_allocated_capacity =
                 (size_type)
                 wasm.exports.
                 super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            filename_02._0_16_ = _auStack_f38;
            filename_02.field_2._8_8_ =
                 wasm.exports.
                 super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            anon_unknown.dwarf_3e7fa::writeModule
                      ((anon_unknown_dwarf_3e7fa *)this_00,(Module *)local_c0,filename_02,
                       (WasmSplitOptions *)__str_1._M_dataplus._M_p);
            if (local_c0 != (undefined1  [8])&__str_1._M_string_length) {
              operator_delete((void *)local_c0,__str_1._M_string_length + 1);
            }
            if ((_Base_ptr *)local_1e8._16_8_ != &local_1c8) {
              operator_delete((void *)local_1e8._16_8_,(ulong)((long)&local_1c8->_M_color + 1));
            }
            std::
            _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_wasm::Name>,_std::_Select1st<std::pair<const_unsigned_long,_wasm::Name>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wasm::Name>_>_>
            ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_wasm::Name>,_std::_Select1st<std::pair<const_unsigned_long,_wasm::Name>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wasm::Name>_>_>
                         *)&keepFuncs);
            std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::~unique_ptr
                      ((unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_> *)psVar1);
            p_Var24 = (_Base_ptr)std::_Rb_tree_increment(p_Var24);
          } while (p_Var24 != (_Rb_tree_node_base *)&splitFuncs);
        }
        p_Var3 = &keepFuncs._M_t._M_impl.super__Rb_tree_header;
        splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)p_Var3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   options.inputFiles.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   options.output._M_dataplus._M_p +
                   (long)options.inputFiles.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
        filename_03.field_2._M_allocated_capacity =
             (size_type)
             wasm.exports.
             super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        filename_03._0_16_ = _auStack_f38;
        filename_03.field_2._8_8_ =
             wasm.exports.
             super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        anon_unknown.dwarf_3e7fa::writeModule
                  ((anon_unknown_dwarf_3e7fa *)(auStack_f38 + 8),
                   (Module *)splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count,filename_03
                   ,(WasmSplitOptions *)
                    CONCAT44(keepFuncs._M_t._M_impl._4_4_,keepFuncs._M_t._M_impl._0_4_));
        if ((_Rb_tree_header *)splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count != p_Var3
           ) {
          operator_delete((void *)splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          keepFuncs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
        }
        if (local_330._M_nxt != &local_320) {
          operator_delete(local_330._M_nxt,(ulong)((long)&(local_320._M_nxt)->_M_nxt + 1));
        }
        std::
        _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
        ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                     *)auStack_388);
        if (local_158 != (undefined1  [8])&line._M_string_length) {
          operator_delete((void *)local_158,
                          CONCAT62(line._M_string_length._2_6_,
                                   CONCAT11(line._M_string_length._1_1_,
                                            (undefined1)line._M_string_length)) + 1);
        }
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)((long)&__str.field_2 + 8));
        if (local_188 != (undefined1  [8])&currModule._M_string_length) {
          operator_delete((void *)local_188,
                          CONCAT62(currModule._M_string_length._2_6_,
                                   CONCAT11(currModule._M_string_length._1_1_,
                                            (undefined1)currModule._M_string_length)) + 1);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                     *)((long)&__str_1.field_2 + 8));
        ::wasm::Module::~Module((Module *)(auStack_f38 + 8));
        std::ifstream::~ifstream
                  (&options.usedOptions.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        auVar41._8_8_ = wasm.name.super_IString.str._M_len;
        auVar41._0_4_ = wasm.features.features;
        auVar41[4] = wasm.hasFeaturesSection;
        auVar41._5_3_ = wasm._381_3_;
        goto switchD_0010db45_default;
      }
      ::wasm::Fatal::Fatal((Fatal *)(auStack_f38 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)
                 &wasm.exports.
                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish,"File not found: ",0x10);
      ::wasm::Fatal::operator<<((Fatal *)(auStack_f38 + 8),arg);
    }
    goto LAB_0010fc7f;
  case 2:
    ::wasm::Module::Module((Module *)(auStack_f38 + 8));
    anon_unknown.dwarf_3e7fa::parseInput
              ((Module *)(auStack_f38 + 8),(WasmSplitOptions *)&wasm.tagsMap._M_h._M_single_bucket);
    pcVar18 = (char *)::wasm::IString::interned
                                (options.profileExport._M_dataplus._M_p,
                                 options.profileFile.field_2._8_8_,0);
    NVar38.super_IString.str._M_str = pcVar18;
    NVar38.super_IString.str._M_len = (size_t)(auStack_f38 + 8);
    lVar25 = ::wasm::Module::getExportOrNull(NVar38);
    if (lVar25 != 0) {
      ::wasm::Fatal::Fatal
                ((Fatal *)&options.usedOptions.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      p_Var3 = &keepFuncs_1._M_t._M_impl.super__Rb_tree_header;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)p_Var3,"error: Export ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)p_Var3,(char *)options.profileFile.field_2._8_8_,
                 (long)options.profileExport._M_dataplus._M_p);
      ::wasm::Fatal::operator<<
                ((Fatal *)&options.usedOptions.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (char (*) [17])" already exists.");
      ::wasm::Fatal::~Fatal
                ((Fatal *)&options.usedOptions.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    uVar17 = anon_unknown.dwarf_3e7fa::hashFile((string *)options._560_8_);
    auVar41 = ::wasm::IString::interned(3,"env",0);
    splitResults.secondary._M_t.
    super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
    super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl = auVar41._8_8_;
    __str.field_2._8_8_ = auVar41._0_8_;
    splitResults.placeholderMap._M_t._M_impl._0_16_ =
         ::wasm::IString::interned(0xc,"profile-data",0);
    psVar4 = (string *)
             &splitResults.placeholderMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    splitResults.placeholderMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0;
    psVar1 = &splitResults.placeholderMap._M_t._M_impl.super__Rb_tree_header._M_node_count;
    splitResults.placeholderMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)psVar1;
    std::__cxx11::string::_M_construct<char*>
              (psVar4,::wasm::DEFAULT_PROFILE_EXPORT_abi_cxx11_,
               DAT_0012e400 + ::wasm::DEFAULT_PROFILE_EXPORT_abi_cxx11_);
    auVar42._8_8_ =
         splitResults.secondary._M_t.
         super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
         super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
         super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl;
    auVar42._0_8_ = __str.field_2._8_8_;
    if (options.importNamespace._M_dataplus._M_p != (pointer)0x0) {
      auVar42 = ::wasm::IString::interned
                          (options.importNamespace._M_dataplus._M_p,
                           options.secondaryOutput.field_2._8_8_,0);
    }
    splitResults.secondary._M_t.
    super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
    super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl = auVar42._8_8_;
    __str.field_2._8_8_ = auVar42._0_8_;
    auVar41 = (undefined1  [16])splitResults.placeholderMap._M_t._M_impl._0_16_;
    if (options.secondaryMemoryName._M_dataplus._M_p != (pointer)0x0) {
      auVar41 = ::wasm::IString::interned
                          (options.secondaryMemoryName._M_dataplus._M_p,
                           options.placeholderNamespace.field_2._8_8_,0);
      auVar42._8_8_ =
           splitResults.secondary._M_t.
           super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
           super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl;
      auVar42._0_8_ = __str.field_2._8_8_;
    }
    splitResults.secondary._M_t.
    super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
    super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl = auVar42._8_8_;
    __str.field_2._8_8_ = auVar42._0_8_;
    splitResults.placeholderMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ =
         options.super_ToolOptions.disabledFeatures.features;
    splitResults.placeholderMap._M_t._M_impl._0_16_ = auVar41;
    std::__cxx11::string::_M_assign(psVar4);
    puVar28 = (undefined8 *)&options.super_ToolOptions.field_0xb0;
    puVar30 = (undefined8 *)auStack_388;
    for (lVar25 = 8; lVar25 != 0; lVar25 = lVar25 + -1) {
      *puVar30 = *puVar28;
      puVar28 = puVar28 + (ulong)bVar35 * -2 + 1;
      puVar30 = puVar30 + (ulong)bVar35 * -2 + 1;
    }
    local_340._0_8_ = (__buckets_ptr)0x0;
    local_340._8_8_ = options.super_ToolOptions.passOptions.arguments._M_h._M_buckets;
    local_330._M_nxt = (_Hash_node_base *)0x0;
    local_328 = options.super_ToolOptions.passOptions.arguments._M_h._M_before_begin._M_nxt;
    local_320._M_nxt =
         (_Hash_node_base *)options.super_ToolOptions.passOptions.arguments._M_h._M_element_count;
    sStack_318 = options.super_ToolOptions.passOptions.arguments._M_h._M_rehash_policy._0_8_;
    local_310 = (__node_base_ptr)0x0;
    splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_340;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,std::__cxx11::string>,true>>>>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)local_340,
               (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)&options.super_ToolOptions.passOptions.targetJS,
               (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>_>_>
                *)&splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count);
    local_308[0]._M_buckets = (__buckets_ptr)0x0;
    local_308[0]._M_bucket_count =
         (size_type)options.super_ToolOptions.passOptions.passesToSkip._M_h._M_buckets;
    local_308[0]._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_308[0]._M_element_count =
         (size_type)options.super_ToolOptions.passOptions.passesToSkip._M_h._M_before_begin._M_nxt;
    local_308[0]._M_rehash_policy._0_8_ =
         options.super_ToolOptions.passOptions.passesToSkip._M_h._M_element_count;
    local_308[0]._M_rehash_policy._M_next_resize =
         options.super_ToolOptions.passOptions.passesToSkip._M_h._M_rehash_policy._0_8_;
    local_308[0]._M_single_bucket = (__node_base_ptr)0x0;
    splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_308;
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_assign<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)local_308,
               (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)&options.super_ToolOptions.passOptions.arguments._M_h._M_single_bucket,
               (_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
                *)&splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count);
    ::wasm::PassRunner::PassRunner
              ((PassRunner *)
               &options.usedOptions.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(Module *)(auStack_f38 + 8),
               (PassOptions *)auStack_388);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(local_308);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_340);
    this_01 = (Instrumenter *)operator_new(0xa8);
    ::wasm::Instrumenter::Instrumenter
              (this_01,(InstrumenterConfig *)((long)&__str.field_2 + 8),uVar17);
    __str_1.field_2._8_8_ = this_01;
    ::wasm::PassRunner::add
              ((PassRunner *)
               &options.usedOptions.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *)
               ((long)&__str_1.field_2 + 8));
    if (__str_1.field_2._8_8_ != 0) {
      (**(code **)(*(long *)__str_1.field_2._8_8_ + 8))();
    }
    __str_1.field_2._8_8_ = 0;
    ::wasm::PassRunner::run();
    anon_unknown.dwarf_3e7fa::adjustTableSize
              ((anon_unknown_dwarf_3e7fa *)
               wasm.dataSegments.
               super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (Module *)
               wasm.tables.
               super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,options.outPrefix.field_2._8_4_,false);
    p_Var3 = &keepFuncs._M_t._M_impl.super__Rb_tree_header;
    splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)p_Var3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count,
               options.inputFiles.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,
               options.output._M_dataplus._M_p +
               (long)options.inputFiles.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    filename_01.field_2._M_allocated_capacity =
         (size_type)
         wasm.exports.
         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    filename_01._0_16_ = _auStack_f38;
    filename_01.field_2._8_8_ =
         wasm.exports.
         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    anon_unknown.dwarf_3e7fa::writeModule
              ((anon_unknown_dwarf_3e7fa *)(auStack_f38 + 8),
               (Module *)splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count,filename_01,
               (WasmSplitOptions *)
               CONCAT44(keepFuncs._M_t._M_impl._4_4_,keepFuncs._M_t._M_impl._0_4_));
    if ((_Rb_tree_header *)splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count != p_Var3) {
      operator_delete((void *)splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count,
                      keepFuncs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
    }
    ::wasm::PassRunner::~PassRunner
              ((PassRunner *)
               &options.usedOptions.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    auVar8._8_8_ = wasm.name.super_IString.str._M_len;
    auVar8._0_4_ = wasm.features.features;
    auVar8[4] = wasm.hasFeaturesSection;
    auVar8._5_3_ = wasm._381_3_;
    if (splitResults.placeholderMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
        (_Base_ptr)psVar1) {
      operator_delete(splitResults.placeholderMap._M_t._M_impl.super__Rb_tree_header._M_header.
                      _M_left,splitResults.placeholderMap._M_t._M_impl.super__Rb_tree_header.
                              _M_node_count + 1);
      auVar8._8_8_ = wasm.name.super_IString.str._M_len;
      auVar8._0_4_ = wasm.features.features;
      auVar8[4] = wasm.hasFeaturesSection;
      auVar8._5_3_ = wasm._381_3_;
    }
    break;
  case 3:
    anon_unknown.dwarf_3e7fa::readProfile
              ((ProfileData *)
               &options.usedOptions.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)options._560_8_);
    __str.field_2._8_8_ = 0;
    splitResults.secondary._M_t.
    super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
    super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::Module,_std::default_delete<wasm::Module>,_true,_true>)
         (__uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>)0x0;
    splitResults.placeholderMap._M_t._M_impl._0_8_ = 0;
    if (options.mode._2_1_ == 1) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)((long)&__str.field_2 + 8)
                 ,keepFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ -
                  CONCAT44(keepFuncs_1._M_t._M_impl._4_4_,keepFuncs_1._M_t._M_impl._0_4_) >> 3);
      lVar25 = keepFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ -
               CONCAT44(keepFuncs_1._M_t._M_impl._4_4_,keepFuncs_1._M_t._M_impl._0_4_);
      if (lVar25 != 0) {
        lVar25 = lVar25 >> 3;
        lVar29 = 0;
        do {
          if (*(long *)(CONCAT44(keepFuncs_1._M_t._M_impl._4_4_,keepFuncs_1._M_t._M_impl._0_4_) +
                       lVar29 * 8) != 0) {
            *(undefined8 *)(__str.field_2._8_8_ + lVar29 * 8) = 1;
          }
          lVar29 = lVar29 + 1;
        } while (lVar25 + (ulong)(lVar25 == 0) != lVar29);
      }
    }
    file = (string *)options._560_8_;
    pbVar22 = options.inputFiles.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (0x20 < (ulong)((long)options.inputFiles.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start - options._560_8_)) {
      uVar27 = 1;
      do {
        lVar25 = uVar27 * 0x20;
        anon_unknown.dwarf_3e7fa::readProfile
                  ((ProfileData *)auStack_388,(string *)(options._560_8_ + lVar25));
        if (auStack_388 !=
            (undefined1  [8])
            options.usedOptions.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          ::wasm::Fatal::Fatal((Fatal *)(auStack_f38 + 8));
          ppuVar5 = &wasm.exports.
                     super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)ppuVar5,"Checksum in profile ",0x14);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)ppuVar5,*(char **)(options._560_8_ + lVar25),
                     *(long *)(options._560_8_ + 8 + lVar25));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)ppuVar5," does not match hash in profile ",0x20);
          ::wasm::Fatal::operator<<
                    ((Fatal *)(auStack_f38 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     options._560_8_);
          goto LAB_0010fc7f;
        }
        lVar29 = CONCAT44(keepFuncs_1._M_t._M_impl._4_4_,keepFuncs_1._M_t._M_impl._0_4_);
        if (splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ -
            splitFuncs_1._M_t._M_impl._0_8_ !=
            keepFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ - lVar29) {
          ::wasm::Fatal::Fatal((Fatal *)(auStack_f38 + 8));
          ppuVar5 = &wasm.exports.
                     super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppuVar5,"Profile ",8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)ppuVar5,*(char **)(options._560_8_ + lVar25),
                     *(long *)(options._560_8_ + 8 + lVar25));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)ppuVar5," incompatible with profile ",0x1b);
          ::wasm::Fatal::operator<<
                    ((Fatal *)(auStack_f38 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     options._560_8_);
          goto LAB_0010fc7f;
        }
        if (keepFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ == lVar29) {
          if (splitFuncs_1._M_t._M_impl._0_8_ != 0) goto LAB_0010ed3b;
        }
        else {
          lVar25 = keepFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ - lVar29 >> 3;
          lVar31 = 0;
          do {
            uVar7 = *(ulong *)(lVar29 + lVar31 * 8);
            uVar32 = *(ulong *)(splitFuncs_1._M_t._M_impl._0_8_ + lVar31 * 8);
            if (uVar7 == 0) {
              if (uVar32 != 0) goto LAB_0010ed19;
            }
            else if (uVar32 != 0) {
              if (uVar7 <= uVar32) {
                uVar32 = uVar7;
              }
LAB_0010ed19:
              *(ulong *)(lVar29 + lVar31 * 8) = uVar32;
            }
            if ((options.mode._2_1_ != Split >> 0x10) &&
               (*(long *)(splitFuncs_1._M_t._M_impl._0_8_ + lVar31 * 8) != 0)) {
              plVar23 = (long *)(__str.field_2._8_8_ + lVar31 * 8);
              *plVar23 = *plVar23 + 1;
            }
            lVar31 = lVar31 + 1;
          } while (lVar25 + (ulong)(lVar25 == 0) != lVar31);
LAB_0010ed3b:
          operator_delete((void *)splitFuncs_1._M_t._M_impl._0_8_,
                          (long)splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                          - splitFuncs_1._M_t._M_impl._0_8_);
        }
        uVar27 = uVar27 + 1;
        file = (string *)options._560_8_;
        pbVar22 = options.inputFiles.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar27 < (ulong)((long)options.inputFiles.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start - options._560_8_ >>
                               5));
    }
    if ((file != pbVar22) && (options.mode._2_1_ != Split >> 0x10)) {
      do {
        anon_unknown.dwarf_3e7fa::readProfile((ProfileData *)(auStack_f38 + 8),file);
        if ((long)wasm.exports.
                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)wasm.exports.
                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != 0) {
          lVar25 = (long)wasm.exports.
                         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)wasm.exports.
                         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3;
          lVar29 = 0;
          do {
            if ((wasm.exports.
                 super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar29]._M_t.
                 super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                 super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl != (Export *)0x0) &&
               (*(long *)(__str.field_2._8_8_ + lVar29 * 8) == 1)) goto LAB_0010ee21;
            lVar29 = lVar29 + 1;
          } while (lVar25 + (ulong)(lVar25 == 0) != lVar29);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Profile ",8);
        poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,(file->_M_dataplus)._M_p,file->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar19," only includes functions included in other profiles.\n",0x35);
        if (wasm.exports.
            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
LAB_0010ee21:
          operator_delete(wasm.exports.
                          super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)wasm.exports.
                                super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)wasm.exports.
                                super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        file = file + 1;
      } while (file != pbVar22);
    }
    auStack_388 = (undefined1  [8])0x0;
    splitFuncs_1._M_t._M_impl._0_8_ = 0;
    splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    ::wasm::BufferWithRandomAccess::operator<<
              ((BufferWithRandomAccess *)auStack_388,
               (int64_t)options.usedOptions.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    lVar25 = CONCAT44(keepFuncs_1._M_t._M_impl._4_4_,keepFuncs_1._M_t._M_impl._0_4_);
    if (keepFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ != lVar25) {
      uVar27 = 0;
      do {
        ::wasm::BufferWithRandomAccess::operator<<
                  ((BufferWithRandomAccess *)auStack_388,*(int32_t *)(lVar25 + uVar27 * 8));
        uVar27 = uVar27 + 1;
        lVar25 = CONCAT44(keepFuncs_1._M_t._M_impl._4_4_,keepFuncs_1._M_t._M_impl._0_4_);
      } while (uVar27 < (ulong)(keepFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ -
                                lVar25 >> 3));
    }
    ::wasm::Output::Output
              ((Output *)(auStack_f38 + 8),
               (string *)
               &options.inputFiles.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,Binary);
    uVar14 = splitFuncs_1._M_t._M_impl._0_8_;
    if (auStack_388 != (undefined1  [8])splitFuncs_1._M_t._M_impl._0_8_) {
      auVar34 = auStack_388;
      do {
        splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count =
             CONCAT71(splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count._1_7_,
                      *(undefined1 *)&(((pointer)auVar34)->_M_dataplus)._M_p);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&wasm.typeIndices._M_h._M_single_bucket,
                   (char *)&splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count,1);
        auVar34 = (undefined1  [8])((long)&(((pointer)auVar34)->_M_dataplus)._M_p + 1);
      } while (auVar34 != (undefined1  [8])uVar14);
    }
    ::wasm::Output::~Output((Output *)(auStack_f38 + 8));
    if (auStack_388 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_388,
                      splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ -
                      (long)auStack_388);
    }
    if (__str.field_2._8_8_ != 0) {
      operator_delete((void *)__str.field_2._8_8_,
                      splitResults.placeholderMap._M_t._M_impl._0_8_ - __str.field_2._8_8_);
    }
    auVar41._8_8_ = wasm.name.super_IString.str._M_len;
    auVar41._0_4_ = wasm.features.features;
    auVar41[4] = wasm.hasFeaturesSection;
    auVar41._5_3_ = wasm._381_3_;
    uVar14 = CONCAT44(keepFuncs_1._M_t._M_impl._4_4_,keepFuncs_1._M_t._M_impl._0_4_);
    if ((void *)uVar14 == (void *)0x0) goto switchD_0010db45_default;
    uVar27 = (long)keepFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent - uVar14;
    goto LAB_0010ef4e;
  case 4:
    p_Var3 = &splitFuncs._M_t._M_impl.super__Rb_tree_header;
    __str_1.field_2._8_8_ = p_Var3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)((long)&__str_1.field_2 + 8),*(long *)options._560_8_,
               *(long *)(options._560_8_ + 8) + *(long *)options._560_8_);
    anon_unknown.dwarf_3e7fa::checkExists((string *)&options.usePlaceholders);
    anon_unknown.dwarf_3e7fa::checkExists((string *)((long)&__str_1.field_2 + 8));
    ::wasm::Module::Module((Module *)(auStack_f38 + 8));
    pp_Var2 = &wasm.tagsMap._M_h._M_single_bucket;
    anon_unknown.dwarf_3e7fa::parseInput((Module *)(auStack_f38 + 8),(WasmSplitOptions *)pp_Var2);
    keepFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&keepFuncs_1;
    keepFuncs_1._M_t._M_impl._0_4_ = 0;
    keepFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    keepFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    keepFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&splitFuncs_1;
    splitFuncs_1._M_t._M_impl._0_8_ = (ulong)(uint)splitFuncs_1._M_t._M_impl._4_4_ << 0x20;
    splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    keepFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         keepFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    uVar17 = anon_unknown.dwarf_3e7fa::hashFile((string *)((long)&__str_1.field_2 + 8));
    anon_unknown.dwarf_3e7fa::getFunctionsToKeepAndSplit
              ((Module *)(auStack_f38 + 8),uVar17,(string *)&options.usePlaceholders,
               (set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)
               &options.usedOptions.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)auStack_388);
    local_1e8._16_8_ = pp_Var2;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Keeping functions: ",0x13);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                *)((long)&__str.field_2 + 8),
               (_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                *)&options.usedOptions.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
    currModule._M_string_length._0_1_ = 0x2b;
    currModule._M_string_length._1_1_ = 0;
    currModule._M_dataplus._M_p = (pointer)0x1;
    local_188 = (undefined1  [8])&currModule._M_string_length;
    (anonymous_namespace)::printReadableProfile(wasm::WasmSplitOptions_const&)::$_0::operator()
              (local_1e8 + 0x10,
               (set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)
               ((long)&__str.field_2 + 8),(string *)local_188);
    if (local_188 != (undefined1  [8])&currModule._M_string_length) {
      operator_delete((void *)local_188,
                      CONCAT62(currModule._M_string_length._2_6_,
                               CONCAT11(currModule._M_string_length._1_1_,
                                        (undefined1)currModule._M_string_length)) + 1);
    }
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)((long)&__str.field_2 + 8));
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Splitting out functions: ",0x19);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                *)&splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                *)auStack_388);
    line._M_string_length._0_1_ = 0x2d;
    line._M_string_length._1_1_ = 0;
    line._M_dataplus._M_p = (pointer)0x1;
    local_158 = (undefined1  [8])&line._M_string_length;
    (anonymous_namespace)::printReadableProfile(wasm::WasmSplitOptions_const&)::$_0::operator()
              (local_1e8 + 0x10,
               (set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)
               &splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count,(string *)local_158);
    if (local_158 != (undefined1  [8])&line._M_string_length) {
      operator_delete((void *)local_158,
                      CONCAT62(line._M_string_length._2_6_,
                               CONCAT11(line._M_string_length._1_1_,
                                        (undefined1)line._M_string_length)) + 1);
    }
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)&splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)auStack_388);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)&options.usedOptions.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ::wasm::Module::~Module((Module *)(auStack_f38 + 8));
    auVar41._8_8_ = wasm.name.super_IString.str._M_len;
    auVar41._0_4_ = wasm.features.features;
    auVar41[4] = wasm.hasFeaturesSection;
    auVar41._5_3_ = wasm._381_3_;
    if ((_Rb_tree_header *)__str_1.field_2._8_8_ == p_Var3) goto switchD_0010db45_default;
    uVar27 = splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1;
    uVar14 = __str_1.field_2._8_8_;
LAB_0010ef4e:
    operator_delete((void *)uVar14,uVar27);
    auVar41._8_8_ = wasm.name.super_IString.str._M_len;
    auVar41._0_4_ = wasm.features.features;
    auVar41[4] = wasm.hasFeaturesSection;
    auVar41._5_3_ = wasm._381_3_;
  default:
    goto switchD_0010db45_default;
  }
  wasm._376_16_ = auVar8;
  ::wasm::Module::~Module((Module *)(auStack_f38 + 8));
  auVar41 = (undefined1  [16])wasm._376_16_;
switchD_0010db45_default:
  wasm._376_16_ = auVar41;
  ::wasm::WasmSplitOptions::~WasmSplitOptions
            ((WasmSplitOptions *)&wasm.tagsMap._M_h._M_single_bucket);
  return 0;
}

Assistant:

int main(int argc, const char* argv[]) {
  WasmSplitOptions options;
  options.parse(argc, argv);

  if (!options.validate()) {
    Fatal() << "Invalid command line arguments";
  }

  switch (options.mode) {
    case WasmSplitOptions::Mode::Split:
      splitModule(options);
      break;
    case WasmSplitOptions::Mode::MultiSplit:
      multiSplitModule(options);
      break;
    case WasmSplitOptions::Mode::Instrument:
      instrumentModule(options);
      break;
    case WasmSplitOptions::Mode::MergeProfiles:
      mergeProfiles(options);
      break;
    case WasmSplitOptions::Mode::PrintProfile:
      printReadableProfile(options);
      break;
  }
}